

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma__is_channel_map_valid(ma_channel *channelMap,ma_uint32 channels)

{
  uint local_24;
  uint local_20;
  ma_uint32 jChannel;
  ma_uint32 iChannel;
  ma_uint32 channels_local;
  ma_channel *channelMap_local;
  
  if (*channelMap != '\0') {
    if (channels == 0) {
      return 0;
    }
    for (local_20 = 0; local_24 = local_20, local_20 < channels; local_20 = local_20 + 1) {
      while (local_24 = local_24 + 1, local_24 < channels) {
        if (channelMap[local_20] == channelMap[local_24]) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static ma_bool32 ma__is_channel_map_valid(const ma_channel* channelMap, ma_uint32 channels)
{
    /* A blank channel map should be allowed, in which case it should use an appropriate default which will depend on context. */
    if (channelMap[0] != MA_CHANNEL_NONE) {
        ma_uint32 iChannel;

        if (channels == 0) {
            return MA_FALSE;   /* No channels. */
        }

        /* A channel cannot be present in the channel map more than once. */
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            ma_uint32 jChannel;
            for (jChannel = iChannel + 1; jChannel < channels; ++jChannel) {
                if (channelMap[iChannel] == channelMap[jChannel]) {
                    return MA_FALSE;
                }
            }
        }
    }

    return MA_TRUE;
}